

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O0

err_t btokBAuthCTStepG(octet *key,void *state)

{
  bool_t bVar1;
  void *in_RSI;
  void *in_RDI;
  bake_bauth_ct_o *s;
  void *in_stack_ffffffffffffffd8;
  
  bVar1 = objIsOperable(in_stack_ffffffffffffffd8);
  if ((bVar1 != 0) && (bVar1 = memIsValid(in_RDI,0x20), bVar1 != 0)) {
    memCopy(in_RSI,in_stack_ffffffffffffffd8,0x15e790);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t btokBAuthCTStepG(octet key[32], void* state)
{
	bake_bauth_ct_o* s = (bake_bauth_ct_o*)state;
	// проверить входные данные
	if (!objIsOperable(s) ||
		!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// key <- K0
	memCopy(key, s->K0, 32);
	// все нормально
	return ERR_OK;
}